

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlWorker.cpp
# Opt level: O1

void __thiscall
adios2::query::XmlWorker::ConstructTree(XmlWorker *this,RangeTree *host,xml_node *node)

{
  string hint;
  string hint_00;
  string hint_01;
  bool bVar1;
  Relation RVar2;
  Op op;
  char_t *pcVar3;
  xml_node *pxVar4;
  string opStr;
  RangeTree subNode;
  string valStr;
  string relationStr;
  xml_named_node_iterator __end2;
  xml_named_node_iterator __begin2;
  undefined1 in_stack_fffffffffffffda8 [16];
  _Alloc_hider in_stack_fffffffffffffdb8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228;
  undefined1 local_218 [32];
  vector<adios2::query::RangeTree,_std::allocator<adios2::query::RangeTree>_> vStack_1f8;
  undefined1 local_1e0 [24];
  xml_node local_1c8;
  xml_node xStack_1c0;
  char_t *local_1b8;
  XmlWorker *local_1b0;
  xml_node local_1a8 [2];
  undefined1 local_198 [16];
  xml_node local_188 [2];
  undefined1 local_178 [32];
  undefined1 local_158 [32];
  undefined1 local_138 [16];
  xml_node_struct *local_128;
  undefined1 local_118 [16];
  xml_node_struct *local_108;
  undefined1 local_f8 [16];
  undefined1 *local_e8;
  undefined1 local_d8 [16];
  xml_node local_c8 [2];
  undefined1 local_b8 [16];
  undefined1 *local_a8;
  long local_a0;
  undefined1 local_98 [16];
  string local_88;
  xml_named_node_iterator local_68;
  xml_named_node_iterator local_48;
  
  local_1b0 = this;
  local_c8[0]._root = (xml_node_struct *)local_b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"value","");
  local_e8 = local_d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"in query","");
  hint.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffdb8._M_p;
  hint._M_dataplus._M_p = (pointer)in_stack_fffffffffffffda8._0_8_;
  hint._M_string_length = in_stack_fffffffffffffda8._8_8_;
  hint.field_2._8_8_ = node;
  helper::XMLAttribute((string *)local_218,local_c8,hint,SUB81(node,0));
  pcVar3 = pugi::xml_attribute::value((xml_attribute *)local_218._0_8_);
  std::__cxx11::string::string((string *)&local_a8,pcVar3,(allocator *)local_1e0);
  if ((xml_attribute *)local_218._0_8_ != (xml_attribute *)0x0) {
    operator_delete((void *)local_218._0_8_);
  }
  local_218._0_8_ = (pointer)0x0;
  if (local_e8 != local_d8) {
    operator_delete(local_e8);
  }
  if (local_c8[0]._root != (xml_node_struct *)local_b8) {
    operator_delete(local_c8[0]._root);
  }
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_88,local_a8,local_a8 + local_a0);
  RVar2 = strToRelation(&local_88);
  host->m_Relation = RVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  pugi::xml_node::children
            ((xml_object_range<pugi::xml_named_node_iterator> *)local_218,node,"range");
  local_48._name = (char_t *)local_218._16_8_;
  local_48._wrap._root = (xml_node_struct *)local_218._0_8_;
  local_48._parent._root = (xml_node_struct *)local_218._8_8_;
  local_68._name =
       (char_t *)
       vStack_1f8.
       super__Vector_base<adios2::query::RangeTree,_std::allocator<adios2::query::RangeTree>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_68._wrap._root = (xml_node_struct *)local_218._24_8_;
  local_68._parent._root =
       (xml_node_struct *)
       vStack_1f8.
       super__Vector_base<adios2::query::RangeTree,_std::allocator<adios2::query::RangeTree>_>.
       _M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    bVar1 = pugi::xml_named_node_iterator::operator!=(&local_48,&local_68);
    if (!bVar1) break;
    pxVar4 = pugi::xml_named_node_iterator::operator*(&local_48);
    local_188[0]._root = (xml_node_struct *)local_178;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_188,"value","");
    local_108 = (xml_node_struct *)local_f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"in query","");
    hint_00.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffdb8._M_p;
    hint_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffffda8._0_8_;
    hint_00._M_string_length = in_stack_fffffffffffffda8._8_8_;
    hint_00.field_2._8_8_ = node;
    helper::XMLAttribute((string *)&local_238,local_188,hint_00,SUB81(pxVar4,0));
    pcVar3 = pugi::xml_attribute::value((xml_attribute *)local_238._M_allocated_capacity);
    std::__cxx11::string::string((string *)local_1e0,pcVar3,(allocator *)&stack0xfffffffffffffdb8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_allocated_capacity !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete((void *)local_238._M_allocated_capacity);
    }
    local_238._M_allocated_capacity = 0;
    if (local_108 != (xml_node_struct *)local_f8) {
      operator_delete(local_108);
    }
    if (local_188[0]._root != (xml_node_struct *)local_178) {
      operator_delete(local_188[0]._root);
    }
    local_1a8[0]._root = (xml_node_struct *)local_198;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"compare","");
    local_128 = (xml_node_struct *)local_118;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"in query","");
    hint_01.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffdb8._M_p;
    hint_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffffda8._0_8_;
    hint_01._M_string_length = in_stack_fffffffffffffda8._8_8_;
    hint_01.field_2._8_8_ = node;
    helper::XMLAttribute((string *)&stack0xfffffffffffffdb8,local_1a8,hint_01,SUB81(pxVar4,0));
    pcVar3 = pugi::xml_attribute::value((xml_attribute *)in_stack_fffffffffffffdb8._M_p);
    std::__cxx11::string::string
              ((string *)local_238._M_local_buf,pcVar3,(allocator *)&stack0xfffffffffffffdb7);
    if ((xml_attribute *)in_stack_fffffffffffffdb8._M_p != (xml_attribute *)0x0) {
      operator_delete(in_stack_fffffffffffffdb8._M_p);
    }
    in_stack_fffffffffffffdb8._M_p = (pointer)0x0;
    if (local_128 != (xml_node_struct *)local_118) {
      operator_delete(local_128);
    }
    if (local_1a8[0]._root != (xml_node_struct *)local_198) {
      operator_delete(local_1a8[0]._root);
    }
    local_158._16_8_ = local_138;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_158 + 0x10),local_238._M_allocated_capacity,
               local_238._8_8_ + local_238._M_allocated_capacity);
    op = strToQueryOp((string *)(local_158 + 0x10));
    local_178._16_8_ = local_158;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_178 + 0x10),local_1e0._0_8_,
               (undefined1 *)
               ((long)(uintptr_t *)local_1e0._0_8_ + (long)(uintptr_t *)local_1e0._8_8_));
    RangeTree::AddLeaf(host,op,(string *)(local_178 + 0x10));
    if ((xml_node_struct *)local_178._16_8_ != (xml_node_struct *)local_158) {
      operator_delete((void *)local_178._16_8_);
    }
    if ((xml_node_struct *)local_158._16_8_ != (xml_node_struct *)local_138) {
      operator_delete((void *)local_158._16_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_allocated_capacity != &local_228) {
      operator_delete((void *)local_238._M_allocated_capacity);
    }
    if ((xml_node_struct *)local_1e0._0_8_ != (xml_node_struct *)(local_1e0 + 0x10)) {
      operator_delete((void *)local_1e0._0_8_);
    }
    pugi::xml_named_node_iterator::operator++(&local_48);
  }
  pugi::xml_node::children((xml_object_range<pugi::xml_named_node_iterator> *)local_1e0,node,"op");
  local_228._M_allocated_capacity = local_1e0._16_8_;
  local_238._M_allocated_capacity = local_1e0._0_8_;
  local_238._8_8_ = local_1e0._8_8_;
  local_48._name = local_1b8;
  local_48._wrap._root = local_1c8._root;
  local_48._parent._root = xStack_1c0._root;
  while( true ) {
    bVar1 = pugi::xml_named_node_iterator::operator!=
                      ((xml_named_node_iterator *)&local_238,&local_48);
    if (!bVar1) break;
    pxVar4 = pugi::xml_named_node_iterator::operator*((xml_named_node_iterator *)&local_238);
    local_218._0_8_ = local_218._0_8_ & 0xffffffff00000000;
    vStack_1f8.
    super__Vector_base<adios2::query::RangeTree,_std::allocator<adios2::query::RangeTree>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    vStack_1f8.
    super__Vector_base<adios2::query::RangeTree,_std::allocator<adios2::query::RangeTree>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_218._24_8_ = 0;
    vStack_1f8.
    super__Vector_base<adios2::query::RangeTree,_std::allocator<adios2::query::RangeTree>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_218._8_8_ = (xml_node_struct *)0x0;
    local_218._16_8_ = 0;
    ConstructTree(local_1b0,(RangeTree *)local_218,pxVar4);
    std::vector<adios2::query::RangeTree,_std::allocator<adios2::query::RangeTree>_>::push_back
              (&host->m_SubNodes,(RangeTree *)local_218);
    std::vector<adios2::query::RangeTree,_std::allocator<adios2::query::RangeTree>_>::~vector
              (&vStack_1f8);
    std::vector<adios2::query::Range,_std::allocator<adios2::query::Range>_>::~vector
              ((vector<adios2::query::Range,_std::allocator<adios2::query::Range>_> *)
               (local_218 + 8));
    pugi::xml_named_node_iterator::operator++((xml_named_node_iterator *)&local_238);
  }
  if (local_a8 != local_98) {
    operator_delete(local_a8);
  }
  return;
}

Assistant:

void XmlWorker::ConstructTree(RangeTree &host, const pugi::xml_node &node)
{
    std::string relationStr = adios2::helper::XMLAttribute("value", node, "in query")->value();
    host.SetRelation(adios2::query::strToRelation(relationStr));
    for (const pugi::xml_node &rangeNode : node.children("range"))
    {
        std::string valStr = adios2::helper::XMLAttribute("value", rangeNode, "in query")->value();
        std::string opStr = adios2::helper::XMLAttribute("compare", rangeNode, "in query")->value();

        host.AddLeaf(adios2::query::strToQueryOp(opStr), valStr);
    }

    for (const pugi::xml_node &opNode : node.children("op"))
    {
        adios2::query::RangeTree subNode;
        ConstructTree(subNode, opNode);
        host.AddNode(subNode);
    }
}